

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  istream *piVar2;
  string line;
  allocator local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  init_step();
  std::__cxx11::string::string((string *)&local_50,"",&local_51);
  while( true ) {
    piVar2 = std::operator>>((istream *)&std::cin,(string *)&local_50);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    bVar1 = std::operator==("Logout",&local_50);
    if (bVar1) break;
    bVar1 = std::operator==(&local_50,"Exit");
    if (bVar1) break;
    bVar1 = std::operator==(&local_50,"exit");
    if (bVar1) break;
    bVar1 = std::operator==(&local_50,"out");
    if (bVar1) break;
    bVar1 = std::operator==("Login",&local_50);
    if (bVar1) {
      Login();
    }
    else {
      bVar1 = std::operator==(&local_50,"GetStudent");
      if (bVar1) {
        GetStudent();
      }
      else {
        bVar1 = std::operator==(&local_50,"GetAdmin");
        if (bVar1) {
          GetAdmin();
        }
        else {
          bVar1 = std::operator==(&local_50,"GetLabEmployees");
          if (bVar1) {
            GetLabEmployees();
          }
          else {
            bVar1 = std::operator==(&local_50,"GetProfessor");
            if (bVar1) {
              GetProfessor();
            }
            else {
              bVar1 = std::operator==(&local_50,"AddNewUser");
              if (bVar1) {
                AddNewUser();
              }
              else {
                bVar1 = std::operator==(&local_50,"Exit");
                if (bVar1) break;
                bVar1 = std::operator==(&local_50,"AddNewRoom");
                if (bVar1) {
                  AddNewRoom();
                }
                else {
                  bVar1 = std::operator==(&local_50,"CanUserEnter");
                  if (bVar1) {
                    CanUserEnter();
                  }
                  else {
                    bVar1 = std::operator==(&local_50,"AddSpecialAccess");
                    if (bVar1) {
                      AddSpecialAccess();
                    }
                    else {
                      bVar1 = std::operator==(&local_50,"RemoveSpecialAccess");
                      if (bVar1) {
                        RemoveSpecialAccess();
                      }
                      else {
                        bVar1 = std::operator==(&local_50,"ChangeGroupsForLabEmployees");
                        if (bVar1) {
                          ChangeGroupsForLabEmployees();
                        }
                        else {
                          bVar1 = std::operator==(&local_50,"ChangeGroupForStudent");
                          if (bVar1) {
                            ChangeGroupForStudent();
                          }
                          else {
                            bVar1 = std::operator==(&local_50,"ShowAllUsers");
                            if (bVar1) {
                              ShowAllUsers();
                            }
                            else {
                              bVar1 = std::operator==(&local_50,"ShowAllRooms");
                              if (bVar1) {
                                ShowAllRooms();
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)&local_50);
  return 0;
}

Assistant:

int main() {
    init_step();
    string line = "";
    while(cin>>line) {
        if("Logout" == line||line == "Exit"||line == "exit" || line == "out"){
            return 0;
        }else if("Login" == line){
            Login();
        }else if(line == "GetStudent"){
            GetStudent();
        }else if(line == "GetAdmin"){
            GetAdmin();
        }else if(line == "GetLabEmployees"){
            GetLabEmployees();
        }else if(line == "GetProfessor"){
            GetProfessor();
        }else if(line  == "AddNewUser"){
            AddNewUser();
        }else if(line == "Exit"){
            return 0;
        }else if(line  == "AddNewRoom"){
            AddNewRoom();
        }else if(line == "CanUserEnter"){
            CanUserEnter();
        }else if(line == "AddSpecialAccess"){
            AddSpecialAccess();
        }else if(line == "RemoveSpecialAccess"){
            RemoveSpecialAccess();
        }else if(line == "ChangeGroupsForLabEmployees"){
            ChangeGroupsForLabEmployees();
        }else if(line == "ChangeGroupForStudent"){
            ChangeGroupForStudent();
        }else if(line == "ShowAllUsers"){
            ShowAllUsers();
        }else if(line == "ShowAllRooms"){
            ShowAllRooms();
        }



    }

    return 0;
}